

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O0

void __thiscall SimpleASTNode::eval(SimpleASTNode *this,int level)

{
  ASTNodeType AVar1;
  bool bVar2;
  int iVar3;
  pointer ppVar4;
  char *pcVar5;
  ostream *poVar6;
  element_type *peVar7;
  reference pvVar8;
  element_type *peVar9;
  undefined1 local_1d8 [8];
  Ptr node_1;
  Ptr node;
  stack<std::shared_ptr<SimpleASTNode>,_std::deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>_>
  tmp;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_158;
  undefined1 local_118 [8];
  Ptr child1_1;
  Ptr child2_1;
  undefined4 local_d4;
  shared_ptr<SimpleASTNode> local_d0;
  undefined1 local_c0 [8];
  Ptr result;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  _Stack_a8;
  int iResult;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_a0;
  iterator search_2;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_90;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_88;
  iterator search_1;
  int iChild2;
  int iChild1;
  Ptr child1;
  undefined1 local_58 [8];
  Ptr child2;
  shared_ptr<SimpleASTNode> *item;
  iterator __end1;
  iterator __begin1;
  list<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_> *__range1;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_20;
  iterator search;
  int level_local;
  SimpleASTNode *this_local;
  
  search.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  ._M_cur._4_4_ = level;
  if ((level != 0) &&
     (bVar2 = std::__cxx11::
              list<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
              ::empty(&this->m_childList), bVar2)) {
    return;
  }
  if ((search.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
       ._M_cur._4_4_ == 0) &&
     (bVar2 = std::__cxx11::
              list<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
              ::empty(&this->m_childList), bVar2)) {
    if (this->m_type != ID) {
      if (this->m_type != INT_LITERAL) {
        return;
      }
      std::operator<<((ostream *)&std::cout,(string *)&this->m_text);
      return;
    }
    local_20._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find(&m_varMap_abi_cxx11_,&this->m_text);
    __range1 = (list<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
                *)std::
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::end(&m_varMap_abi_cxx11_);
    bVar2 = std::__detail::operator!=
                      (&local_20,
                       (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                        *)&__range1);
    if (!bVar2) {
      poVar6 = std::operator<<((ostream *)&std::cout,"Undefined var \'");
      poVar6 = std::operator<<(poVar6,(string *)&this->m_text);
      std::operator<<(poVar6,"\'");
      return;
    }
    poVar6 = std::operator<<((ostream *)&std::cout,(string *)&this->m_text);
    poVar6 = std::operator<<(poVar6,": ");
    ppVar4 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                           *)&local_20);
    std::operator<<(poVar6,(string *)&ppVar4->second);
    return;
  }
  __end1 = std::__cxx11::
           list<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>::
           begin(&this->m_childList);
  item = (shared_ptr<SimpleASTNode> *)
         std::__cxx11::
         list<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>::end
                   (&this->m_childList);
  while (bVar2 = std::operator!=(&__end1,(_Self *)&item), bVar2) {
    child2.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::_List_iterator<std::shared_ptr<SimpleASTNode>_>::operator*(&__end1);
    peVar9 = std::__shared_ptr_access<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)child2.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
    eval(peVar9,search.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                ._M_cur._4_4_ + 1);
    peVar9 = std::__shared_ptr_access<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)child2.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
    if ((peVar9->m_type == ID) ||
       (peVar9 = std::__shared_ptr_access<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)child2.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi), peVar9->m_type == INT_LITERAL)) {
      std::
      stack<std::shared_ptr<SimpleASTNode>,_std::deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>_>
      ::push(&m_evalStack,
             (value_type *)
             child2.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ;
    }
    std::_List_iterator<std::shared_ptr<SimpleASTNode>_>::operator++(&__end1);
  }
  AVar1 = this->m_type;
  if (AVar1 == DECLARATION) goto LAB_0011dfa3;
  if (AVar1 == ASSIGMENT) {
    pvVar8 = std::
             stack<std::shared_ptr<SimpleASTNode>,_std::deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>_>
             ::top(&m_evalStack);
    std::shared_ptr<SimpleASTNode>::shared_ptr
              ((shared_ptr<SimpleASTNode> *)
               &child1_1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               pvVar8);
    std::
    stack<std::shared_ptr<SimpleASTNode>,_std::deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>_>
    ::pop(&m_evalStack);
    pvVar8 = std::
             stack<std::shared_ptr<SimpleASTNode>,_std::deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>_>
             ::top(&m_evalStack);
    std::shared_ptr<SimpleASTNode>::shared_ptr((shared_ptr<SimpleASTNode> *)local_118,pvVar8);
    std::
    stack<std::shared_ptr<SimpleASTNode>,_std::deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>_>
    ::pop(&m_evalStack);
    peVar9 = std::__shared_ptr_access<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_118);
    if (peVar9->m_type == ID) {
      peVar9 = std::__shared_ptr_access<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_118);
      peVar7 = std::__shared_ptr_access<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&child1_1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (&local_158,&peVar9->m_text,&peVar7->m_text);
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::insert(&m_varMap_abi_cxx11_,&local_158);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(&local_158);
    }
    std::shared_ptr<SimpleASTNode>::~shared_ptr((shared_ptr<SimpleASTNode> *)local_118);
    std::shared_ptr<SimpleASTNode>::~shared_ptr
              ((shared_ptr<SimpleASTNode> *)
               &child1_1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    goto LAB_0011dfa3;
  }
  if (1 < AVar1 - ADDITIVE_EXP) goto LAB_0011dfa3;
  pvVar8 = std::
           stack<std::shared_ptr<SimpleASTNode>,_std::deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>_>
           ::top(&m_evalStack);
  std::shared_ptr<SimpleASTNode>::shared_ptr((shared_ptr<SimpleASTNode> *)local_58,pvVar8);
  std::
  stack<std::shared_ptr<SimpleASTNode>,_std::deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>_>
  ::pop(&m_evalStack);
  pvVar8 = std::
           stack<std::shared_ptr<SimpleASTNode>,_std::deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>_>
           ::top(&m_evalStack);
  std::shared_ptr<SimpleASTNode>::shared_ptr((shared_ptr<SimpleASTNode> *)&iChild2,pvVar8);
  std::
  stack<std::shared_ptr<SimpleASTNode>,_std::deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>_>
  ::pop(&m_evalStack);
  peVar9 = std::__shared_ptr_access<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&iChild2);
  if (peVar9->m_type == ID) {
    peVar9 = std::__shared_ptr_access<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&iChild2);
    local_88._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find(&m_varMap_abi_cxx11_,&peVar9->m_text);
    local_90._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(&m_varMap_abi_cxx11_);
    bVar2 = std::__detail::operator!=(&local_88,&local_90);
    if (bVar2) {
      std::__detail::
      _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
      ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                    *)&local_88);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      search_1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
      ._M_cur._4_4_ = atoi(pcVar5);
      goto LAB_0011db2d;
    }
    poVar6 = std::operator<<((ostream *)&std::cout,"Undefined var \'");
    peVar9 = std::__shared_ptr_access<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&iChild2);
    poVar6 = std::operator<<(poVar6,(string *)&peVar9->m_text);
    std::operator<<(poVar6,"\'");
    search_2.
    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
    ._M_cur._4_4_ = 4;
  }
  else {
    peVar9 = std::__shared_ptr_access<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&iChild2);
    if (peVar9->m_type == INT_LITERAL) {
      std::__shared_ptr_access<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 &iChild2);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      search_1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
      ._M_cur._4_4_ = atoi(pcVar5);
    }
LAB_0011db2d:
    peVar9 = std::__shared_ptr_access<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_58);
    if (peVar9->m_type == ID) {
      peVar9 = std::__shared_ptr_access<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_58);
      local_a0._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&m_varMap_abi_cxx11_,&peVar9->m_text);
      _Stack_a8._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end(&m_varMap_abi_cxx11_);
      bVar2 = std::__detail::operator!=(&local_a0,&stack0xffffffffffffff58);
      if (!bVar2) {
        poVar6 = std::operator<<((ostream *)&std::cout,"Undefined var \'");
        peVar9 = std::__shared_ptr_access<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_58);
        poVar6 = std::operator<<(poVar6,(string *)&peVar9->m_text);
        std::operator<<(poVar6,"\'");
        search_2.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
        ._M_cur._4_4_ = 4;
        goto LAB_0011ddbf;
      }
      std::__detail::
      _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
      ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                    *)&local_a0);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      search_1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
      ._M_cur._0_4_ = atoi(pcVar5);
    }
    else {
      peVar9 = std::__shared_ptr_access<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_58);
      if (peVar9->m_type == INT_LITERAL) {
        std::__shared_ptr_access<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   local_58);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        search_1.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
        ._M_cur._0_4_ = atoi(pcVar5);
      }
    }
    result.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 0
    ;
    std::shared_ptr<SimpleASTNode>::shared_ptr((shared_ptr<SimpleASTNode> *)local_c0);
    iVar3 = std::__cxx11::string::compare((char *)&this->m_text);
    if (iVar3 == 0) {
      result.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
           search_1.
           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
           ._M_cur._4_4_ *
           (int)search_1.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                ._M_cur;
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)&this->m_text);
      if (iVar3 == 0) {
        result.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
             = search_1.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
               ._M_cur._4_4_ /
               (int)search_1.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                    ._M_cur;
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)&this->m_text);
        if (iVar3 == 0) {
          result.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _4_4_ = search_1.
                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                  ._M_cur._4_4_ +
                  (int)search_1.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                       ._M_cur;
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)&this->m_text);
          if (iVar3 == 0) {
            result.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
            _4_4_ = search_1.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                    ._M_cur._4_4_ -
                    (int)search_1.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                         ._M_cur;
          }
        }
      }
    }
    local_d4 = 1;
    std::__cxx11::to_string
              ((__cxx11 *)
               &child2_1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               result.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi._4_4_);
    create((ASTNodeType *)&local_d0,(string *)&local_d4);
    std::shared_ptr<SimpleASTNode>::operator=((shared_ptr<SimpleASTNode> *)local_c0,&local_d0);
    std::shared_ptr<SimpleASTNode>::~shared_ptr(&local_d0);
    std::__cxx11::string::~string
              ((string *)
               &child2_1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::
    stack<std::shared_ptr<SimpleASTNode>,_std::deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>_>
    ::push(&m_evalStack,(shared_ptr<SimpleASTNode> *)local_c0);
    std::shared_ptr<SimpleASTNode>::~shared_ptr((shared_ptr<SimpleASTNode> *)local_c0);
    search_2.
    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
    ._M_cur._4_4_ = 0;
  }
LAB_0011ddbf:
  std::shared_ptr<SimpleASTNode>::~shared_ptr((shared_ptr<SimpleASTNode> *)&iChild2);
  std::shared_ptr<SimpleASTNode>::~shared_ptr((shared_ptr<SimpleASTNode> *)local_58);
LAB_0011dfa3:
  if (search.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
      ._M_cur._4_4_ == 0) {
    std::
    stack<std::shared_ptr<SimpleASTNode>,std::deque<std::shared_ptr<SimpleASTNode>,std::allocator<std::shared_ptr<SimpleASTNode>>>>
    ::
    stack<std::deque<std::shared_ptr<SimpleASTNode>,std::allocator<std::shared_ptr<SimpleASTNode>>>,void>
              ((stack<std::shared_ptr<SimpleASTNode>,std::deque<std::shared_ptr<SimpleASTNode>,std::allocator<std::shared_ptr<SimpleASTNode>>>>
                *)&node.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    while (bVar2 = std::
                   stack<std::shared_ptr<SimpleASTNode>,_std::deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>_>
                   ::empty(&m_evalStack), ((bVar2 ^ 0xffU) & 1) != 0) {
      pvVar8 = std::
               stack<std::shared_ptr<SimpleASTNode>,_std::deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>_>
               ::top(&m_evalStack);
      std::shared_ptr<SimpleASTNode>::shared_ptr
                ((shared_ptr<SimpleASTNode> *)
                 &node_1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 pvVar8);
      std::
      stack<std::shared_ptr<SimpleASTNode>,_std::deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>_>
      ::pop(&m_evalStack);
      std::
      stack<std::shared_ptr<SimpleASTNode>,_std::deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>_>
      ::push((stack<std::shared_ptr<SimpleASTNode>,_std::deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>_>
              *)&node.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (value_type *)
             &node_1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::shared_ptr<SimpleASTNode>::~shared_ptr
                ((shared_ptr<SimpleASTNode> *)
                 &node_1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    while (bVar2 = std::
                   stack<std::shared_ptr<SimpleASTNode>,_std::deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>_>
                   ::empty((stack<std::shared_ptr<SimpleASTNode>,_std::deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>_>
                            *)&node.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount), ((bVar2 ^ 0xffU) & 1) != 0) {
      pvVar8 = std::
               stack<std::shared_ptr<SimpleASTNode>,_std::deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>_>
               ::top((stack<std::shared_ptr<SimpleASTNode>,_std::deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>_>
                      *)&node.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount);
      std::shared_ptr<SimpleASTNode>::shared_ptr((shared_ptr<SimpleASTNode> *)local_1d8,pvVar8);
      std::
      stack<std::shared_ptr<SimpleASTNode>,_std::deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>_>
      ::pop((stack<std::shared_ptr<SimpleASTNode>,_std::deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>_>
             *)&node.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      peVar9 = std::__shared_ptr_access<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_1d8);
      std::operator<<((ostream *)&std::cout,(string *)&peVar9->m_text);
      std::shared_ptr<SimpleASTNode>::~shared_ptr((shared_ptr<SimpleASTNode> *)local_1d8);
    }
    std::
    stack<std::shared_ptr<SimpleASTNode>,_std::deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>_>
    ::~stack((stack<std::shared_ptr<SimpleASTNode>,_std::deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>_>
              *)&node.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  return;
}

Assistant:

void SimpleASTNode::eval(int level)
{
    //Recursive ending condition
    if (level && m_childList.empty())
        return;
    else if (!level && m_childList.empty()) {
        //std::cout << "here";
        if (m_type == ASTNodeType::ID) {
            auto search = m_varMap.find(m_text);
            if (search != m_varMap.end()) {
                std::cout << m_text << ": " << search->second;
            } else {
                std::cout << "Undefined var \'" << m_text << "\'";
            }            
        } else if (m_type == ASTNodeType::INT_LITERAL) {
            std::cout << m_text;
        }
        return;
    }
    for (auto& item : m_childList) {
        item->eval(level + 1);
        if (item->m_type == ASTNodeType::ID || item->m_type == ASTNodeType::INT_LITERAL) {
            m_evalStack.push(item);
        }
    }
    switch (m_type) {
        case ASTNodeType::DECLARATION:
            break;
        case ASTNodeType::MULTIL_EXP:
        case ASTNodeType::ADDITIVE_EXP:
        {
            SimpleASTNode::Ptr child2 = m_evalStack.top();
            m_evalStack.pop();
            SimpleASTNode::Ptr child1 = m_evalStack.top();
            m_evalStack.pop();
            int iChild1;
            int iChild2;
            if (child1->m_type == ASTNodeType::ID) {
                auto search = m_varMap.find(child1->m_text);
                if (search != m_varMap.end()) {
                    iChild1 = atoi((search->second).c_str());
                } else {
                    std::cout << "Undefined var \'" << child1->m_text << "\'";
                    break;
                }
            } else if (child1->m_type == ASTNodeType::INT_LITERAL) {
                iChild1 = atoi((child1->m_text).c_str());
            }
            if (child2->m_type == ASTNodeType::ID) {
                auto search = m_varMap.find(child2->m_text);
                if (search != m_varMap.end()) {
                    iChild2 = atoi((search->second).c_str());
                } else {
                    std::cout << "Undefined var \'" << child2->m_text << "\'";
                    break;
                }
            } else if (child2->m_type == ASTNodeType::INT_LITERAL) {
                iChild2 = atoi((child2->m_text).c_str());
            }
            int iResult = 0;
            SimpleASTNode::Ptr result;
            if (!m_text.compare({"*"})) {
                iResult = iChild1 * iChild2;
            } else if (!m_text.compare({"/"})) {
                iResult = iChild1 / iChild2;
            } else if (!m_text.compare({"+"})) {
                iResult = iChild1 + iChild2;
            } else if (!m_text.compare({"-"})) {
                iResult = iChild1 - iChild2;
            }
            result = SimpleASTNode::create(ASTNodeType::INT_LITERAL, std::to_string(iResult));
            m_evalStack.push(result);            
        }
            break;      
        case ASTNodeType::ASSIGMENT:
        {
            SimpleASTNode::Ptr child2 = m_evalStack.top();
            m_evalStack.pop();
            SimpleASTNode::Ptr child1 = m_evalStack.top();
            m_evalStack.pop();
            if (child1->m_type == ASTNodeType::ID) {
                m_varMap.insert({child1->m_text, child2->m_text});
            }
        }   
            break;
        default:
            break;     
    }

    //Handle the final results
    if (!level) {
        std::stack<SimpleASTNode::Ptr> tmp;
        while (!m_evalStack.empty()) {
            SimpleASTNode::Ptr node = m_evalStack.top();
            m_evalStack.pop();
            tmp.push(node);
        }
        while (!tmp.empty()) {
            SimpleASTNode::Ptr node = tmp.top();
            tmp.pop();
            std::cout << node->m_text;
        }
    }
}